

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O3

void __thiscall t_html_generator::generate_program_toc_row(t_html_generator *this,t_program *tprog)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  t_const *ptVar4;
  ostream *poVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  undefined8 *puVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  pointer pptVar13;
  pointer *ppptVar14;
  pointer pptVar15;
  ofstream_with_content_based_conditional_update *poVar16;
  string fn_name;
  string html;
  string name;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  string fname;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  data_types;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ofstream_with_content_based_conditional_update *local_280;
  undefined1 local_278 [32];
  _Rb_tree_node_base *local_258;
  size_t local_250;
  string local_248;
  string local_228;
  t_html_generator *local_208;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  vector<t_const_*,_std::allocator<t_const_*>_> local_1a0;
  long lStack_188;
  t_program *local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  pointer local_148;
  vector<t_function_*,_std::allocator<t_function_*>_> local_140;
  vector<t_service_*,_std::allocator<t_service_*>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1c0 = local_1b0;
  pcVar2 = (tprog->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar2,pcVar2 + (tprog->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_1c0);
  poVar16 = &this->f_out_;
  local_208 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"<tr>",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tprog->name_)._M_dataplus._M_p,(tprog->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</td><td>",9);
  local_280 = poVar16;
  local_180 = tprog;
  if ((tprog->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector(&local_128,&tprog->services_);
    if (local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_200.first.field_2;
      pptVar13 = local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        local_148 = pptVar13;
        (*(local_208->super_t_generator)._vptr_t_generator[0x1a])(local_278,local_208,*pptVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"<a href=\"",9);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_1c0,local_1c0 + local_1b8);
        make_file_link(&local_200.first,local_208,&local_70);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar16,local_200.first._M_dataplus._M_p,
                            local_200.first._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#Svc_",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_278._0_8_,
                            CONCAT44(local_278._12_4_,local_278._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_278._0_8_,
                            CONCAT44(local_278._12_4_,local_278._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</a><br/>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        poVar16 = local_280;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"<ul>",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_178._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_178._M_impl.super__Rb_tree_header._M_header;
        local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_178._M_impl.super__Rb_tree_header._M_header._M_right =
             local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
                  (&local_140,&(*local_148)->functions_);
        for (pptVar15 = local_140.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            p_Var7 = local_178._M_impl.super__Rb_tree_header._M_header._M_left,
            pptVar15 !=
            local_140.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          pcVar2 = ((*pptVar15)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c0,pcVar2,pcVar2 + ((*pptVar15)->name_)._M_string_length);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_1c0,local_1c0 + local_1b8);
          make_file_link(&local_50,local_208,&local_90);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x38dda1);
          local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage;
          plVar9 = plVar6 + 2;
          if ((pointer *)*plVar6 == (pointer *)plVar9) {
            local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
            lStack_188 = plVar6[3];
          }
          else {
            local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
            local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar6;
          }
          local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar10) {
            local_228.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_228.field_2._8_8_ = plVar6[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_228._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_228._M_string_length = plVar6[1];
          *plVar6 = (long)paVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_228,local_278._0_8_);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_248.field_2._M_allocated_capacity = *psVar11;
            local_248.field_2._8_8_ = plVar6[3];
          }
          else {
            local_248.field_2._M_allocated_capacity = *psVar11;
            local_248._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_248._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
          local_320 = &local_310;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_310 = *plVar9;
            lStack_308 = plVar6[3];
          }
          else {
            local_310 = *plVar9;
            local_320 = (long *)*plVar6;
          }
          local_318 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_320,(ulong)local_2c0._M_dataplus._M_p);
          local_300 = &local_2f0;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_2f0 = *plVar9;
            lStack_2e8 = plVar6[3];
          }
          else {
            local_2f0 = *plVar9;
            local_300 = (long *)*plVar6;
          }
          local_2f8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
          local_2e0 = &local_2d0;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_2d0 = *plVar9;
            lStack_2c8 = plVar6[3];
          }
          else {
            local_2d0 = *plVar9;
            local_2e0 = (long *)*plVar6;
          }
          local_2d8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2e0,(ulong)local_2c0._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_200.first.field_2._M_allocated_capacity = *psVar11;
            local_200.first.field_2._8_8_ = plVar6[3];
            local_200.first._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_200.first.field_2._M_allocated_capacity = *psVar11;
            local_200.first._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_200.first._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_2a0.field_2._M_allocated_capacity = *psVar11;
            local_2a0.field_2._8_8_ = plVar6[3];
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          }
          else {
            local_2a0.field_2._M_allocated_capacity = *psVar11;
            local_2a0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_2a0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_200.first._M_dataplus._M_p);
          }
          if (local_2e0 != &local_2d0) {
            operator_delete(local_2e0);
          }
          if (local_300 != &local_2f0) {
            operator_delete(local_300);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p);
          }
          if (local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_200,&local_2c0,&local_2a0);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&local_178,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200.second._M_dataplus._M_p != &local_200.second.field_2) {
            operator_delete(local_200.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_200.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
        }
        for (; poVar16 = local_280,
            (_Rb_tree_header *)p_Var7 != &local_178._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_280,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"</ul>",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        if (local_140.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_178);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        pptVar13 = local_148 + 1;
        tprog = local_180;
      } while (pptVar13 !=
               local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"</td>",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((tprog->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_228,&tprog->enums_);
    if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
      paVar1 = &local_200.first.field_2;
      _Var12._M_p = local_228._M_dataplus._M_p;
      do {
        plVar6 = (long *)(**(code **)(**(long **)_Var12._M_p + 0x18))();
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_278,*plVar6,plVar6[1] + *plVar6);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_1c0,local_1c0 + local_1b8);
        make_file_link(&local_248,local_208,&local_b0);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x38ddef);
        local_320 = &local_310;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_310 = *plVar6;
          lStack_308 = puVar8[3];
        }
        else {
          local_310 = *plVar6;
          local_320 = (long *)*puVar8;
        }
        local_318 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_300 = &local_2f0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2f0 = *plVar6;
          lStack_2e8 = puVar8[3];
        }
        else {
          local_2f0 = *plVar6;
          local_300 = (long *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,local_278._0_8_);
        local_2e0 = &local_2d0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2d0 = *plVar6;
          lStack_2c8 = puVar8[3];
        }
        else {
          local_2d0 = *plVar6;
          local_2e0 = (long *)*puVar8;
        }
        local_2d8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2a0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,local_278._0_8_);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first.field_2._8_8_ = puVar8[3];
          local_200.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_200.first._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0.field_2._8_8_ = plVar6[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2c0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_2c0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_178,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.second._M_dataplus._M_p != &local_200.second.field_2) {
          operator_delete(local_200.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        _Var12._M_p = _Var12._M_p + 8;
        tprog = local_180;
        poVar16 = local_280;
      } while (_Var12._M_p != (pointer)local_228._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  if ((tprog->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_228,&tprog->typedefs_);
    if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
      paVar1 = &local_200.first.field_2;
      _Var12._M_p = local_228._M_dataplus._M_p;
      do {
        local_278._0_8_ = local_278 + 0x10;
        lVar3 = *(long *)(*(size_type *)_Var12._M_p + 0x90);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,lVar3,*(long *)(*(size_type *)_Var12._M_p + 0x98) + lVar3);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_1c0,local_1c0 + local_1b8);
        make_file_link(&local_248,local_208,&local_d0);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x38ddef);
        local_320 = &local_310;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_310 = *plVar6;
          lStack_308 = puVar8[3];
        }
        else {
          local_310 = *plVar6;
          local_320 = (long *)*puVar8;
        }
        local_318 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_300 = &local_2f0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2f0 = *plVar6;
          lStack_2e8 = puVar8[3];
        }
        else {
          local_2f0 = *plVar6;
          local_300 = (long *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,local_278._0_8_);
        local_2e0 = &local_2d0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2d0 = *plVar6;
          lStack_2c8 = puVar8[3];
        }
        else {
          local_2d0 = *plVar6;
          local_2e0 = (long *)*puVar8;
        }
        local_2d8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2a0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,local_278._0_8_);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first.field_2._8_8_ = puVar8[3];
          local_200.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_200.first._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0.field_2._8_8_ = puVar8[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2c0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_2c0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_178,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.second._M_dataplus._M_p != &local_200.second.field_2) {
          operator_delete(local_200.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        _Var12._M_p = _Var12._M_p + 8;
        tprog = local_180;
        poVar16 = local_280;
      } while (_Var12._M_p != (pointer)local_228._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  if ((tprog->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_228,&tprog->objects_);
    if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
      paVar1 = &local_200.first.field_2;
      _Var12._M_p = local_228._M_dataplus._M_p;
      do {
        plVar6 = (long *)(**(code **)(**(long **)_Var12._M_p + 0x18))();
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_278,*plVar6,plVar6[1] + *plVar6);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_1c0,local_1c0 + local_1b8);
        make_file_link(&local_248,local_208,&local_f0);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x38ddef);
        local_320 = &local_310;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_310 = *plVar6;
          lStack_308 = puVar8[3];
        }
        else {
          local_310 = *plVar6;
          local_320 = (long *)*puVar8;
        }
        local_318 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_300 = &local_2f0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2f0 = *plVar6;
          lStack_2e8 = puVar8[3];
        }
        else {
          local_2f0 = *plVar6;
          local_300 = (long *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,local_278._0_8_);
        local_2e0 = &local_2d0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2d0 = *plVar6;
          lStack_2c8 = puVar8[3];
        }
        else {
          local_2d0 = *plVar6;
          local_2e0 = (long *)*puVar8;
        }
        local_2d8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2a0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,local_278._0_8_);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first.field_2._8_8_ = puVar8[3];
          local_200.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_200.first._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0.field_2._8_8_ = puVar8[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar11;
          local_2c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2c0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_2c0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_178,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.second._M_dataplus._M_p != &local_200.second.field_2) {
          operator_delete(local_200.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        _Var12._M_p = _Var12._M_p + 8;
        tprog = local_180;
        poVar16 = local_280;
      } while (_Var12._M_p != (pointer)local_228._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  p_Var7 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var7 != &local_178._M_impl.super__Rb_tree_header) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar16,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<br/>",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    poVar16 = local_280;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"</td>",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
  if ((tprog->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tprog->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_278._24_8_ = local_278 + 8;
    local_278._8_4_ = _S_red;
    local_278._16_8_ = 0;
    local_250 = 0;
    local_258 = (_Rb_tree_node_base *)local_278._24_8_;
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_1a0,&tprog->consts_);
    if (local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_200.first.field_2;
      ppptVar14 = (pointer *)
                  local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      do {
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        ptVar4 = (*ppptVar14)[7];
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,ptVar4,
                   (long)&((*ppptVar14)[8]->super_t_doc)._vptr_t_doc + (long)ptVar4);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_1c0,local_1c0 + local_1b8);
        make_file_link(&local_228,local_208,&local_110);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x38dde9);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_248.field_2._M_allocated_capacity = *psVar11;
          local_248.field_2._8_8_ = puVar8[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar11;
          local_248._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_248._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
        local_320 = &local_310;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_310 = *plVar6;
          lStack_308 = puVar8[3];
        }
        else {
          local_310 = *plVar6;
          local_320 = (long *)*puVar8;
        }
        local_318 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_320,(ulong)local_2c0._M_dataplus._M_p);
        local_300 = &local_2f0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2f0 = *plVar6;
          lStack_2e8 = puVar8[3];
        }
        else {
          local_2f0 = *plVar6;
          local_300 = (long *)*puVar8;
        }
        local_2f8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
        local_2e0 = &local_2d0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_2d0 = *plVar6;
          lStack_2c8 = puVar8[3];
        }
        else {
          local_2d0 = *plVar6;
          local_2e0 = (long *)*puVar8;
        }
        local_2d8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2e0,(ulong)local_2c0._M_dataplus._M_p);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first.field_2._8_8_ = puVar8[3];
          local_200.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_200.first.field_2._M_allocated_capacity = *psVar11;
          local_200.first._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_200.first._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0.field_2._8_8_ = puVar8[3];
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *psVar11;
          local_2a0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2a0._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_200,&local_2c0,&local_2a0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_278,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.second._M_dataplus._M_p != &local_200.second.field_2) {
          operator_delete(local_200.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_200.first._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        ppptVar14 = ppptVar14 + 1;
      } while ((pointer)ppptVar14 !=
               local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    poVar16 = local_280;
    p_Var7 = (_Rb_tree_node_base *)local_278._24_8_;
    while (local_280 = poVar16, p_Var7 != (_Rb_tree_node_base *)(local_278 + 8)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar16,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<br/>",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      poVar16 = local_280;
    }
    if (local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_278);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"</td>",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar16,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</tr>",5);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_178);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  return;
}

Assistant:

void t_html_generator::generate_program_toc_row(t_program* tprog) {
  string fname = tprog->get_name() + ".html";
  f_out_ << "<tr>" << endl << "<td>" << tprog->get_name() << "</td><td>";
  if (!tprog->get_services().empty()) {
    vector<t_service*> services = tprog->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      string name = get_service_name(*sv_iter);
      f_out_ << "<a href=\"" << make_file_link(fname) << "#Svc_" << name << "\">" << name
             << "</a><br/>" << endl;
      f_out_ << "<ul>" << endl;
      map<string, string> fn_html;
      vector<t_function*> functions = (*sv_iter)->get_functions();
      vector<t_function*>::iterator fn_iter;
      for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
        string fn_name = (*fn_iter)->get_name();
        string html = "<li><a href=\"" + make_file_link(fname) + "#Fn_" + name + "_" + fn_name
                      + "\">" + fn_name + "</a></li>";
        fn_html.insert(pair<string, string>(fn_name, html));
      }
      for (auto & html_iter : fn_html) {
        f_out_ << html_iter.second << endl;
      }
      f_out_ << "</ul>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "<td>";
  map<string, string> data_types;
  if (!tprog->get_enums().empty()) {
    vector<t_enum*> enums = tprog->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      string name = (*en_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Enum_" << name << "\">" << name
      // <<  "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Enum_" + name + "\">" + name + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_typedefs().empty()) {
    vector<t_typedef*> typedefs = tprog->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      string name = (*td_iter)->get_symbolic();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Typedef_" << name << "\">" << name
      // << "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Typedef_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_objects().empty()) {
    vector<t_struct*> objects = tprog->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      string name = (*o_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Struct_" << name << "\">" << name
      //<< "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Struct_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  for (auto & data_type : data_types) {
    f_out_ << data_type.second << "<br/>" << endl;
  }
  f_out_ << "</td>" << endl << "<td>";
  if (!tprog->get_consts().empty()) {
    map<string, string> const_html;
    vector<t_const*> consts = tprog->get_consts();
    vector<t_const*>::iterator con_iter;
    for (con_iter = consts.begin(); con_iter != consts.end(); ++con_iter) {
      string name = (*con_iter)->get_name();
      string html = "<code><a href=\"" + make_file_link(fname) + "#Const_" + name + "\">" + name
                    + "</a></code>";
      const_html.insert(pair<string, string>(name, html));
    }
    for (auto & con_iter : const_html) {
      f_out_ << con_iter.second << "<br/>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "</tr>";
}